

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::char_spec_handler::on_int(char_spec_handler *this)

{
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this_00;
  size_t in_RCX;
  
  this_00 = this->formatter;
  if (this_00->specs_ != (basic_format_specs<char> *)0x0) {
    basic_writer<fmt::v6::buffer_range<char>>::write_int<char,fmt::v6::basic_format_specs<char>>
              ((basic_writer<fmt::v6::buffer_range<char>> *)this_00,this->value,this_00->specs_);
    return;
  }
  basic_writer<fmt::v6::buffer_range<char>_>::write
            (&this_00->writer_,(int)this->value,(void *)0x0,in_RCX);
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.writer_.write_int(value, *formatter.specs_);
      else
        formatter.writer_.write(value);
    }